

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-train.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ggml_opt_dataset_t dataset;
  undefined8 extraout_RAX;
  int iVar3;
  char *__s;
  mnist_model model;
  allocator<char> local_142;
  allocator<char> local_141;
  string local_140;
  string local_120;
  mnist_model local_100;
  
  if (0xfffffffd < argc - 7U) {
    dataset = (ggml_opt_dataset_t)ggml_opt_dataset_init(0x310,10,60000,10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,argv[3],(allocator<char> *)&local_140);
    bVar2 = mnist_image_load(&local_100.arch,dataset);
    paVar1 = &local_100.arch.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.arch._M_dataplus._M_p != paVar1) {
      operator_delete(local_100.arch._M_dataplus._M_p,
                      local_100.arch.field_2._M_allocated_capacity + 1);
    }
    iVar3 = 1;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,argv[4],(allocator<char> *)&local_140);
      bVar2 = mnist_label_load(&local_100.arch,dataset);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100.arch._M_dataplus._M_p != paVar1) {
        operator_delete(local_100.arch._M_dataplus._M_p,
                        local_100.arch.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,argv[1],&local_141);
        if (argc < 6) {
          __s = "";
        }
        else {
          __s = argv[5];
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,__s,&local_142);
        mnist_model_init_random(&local_100,&local_140,&local_120,1000,500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        mnist_model_build(&local_100);
        mnist_model_train(&local_100,dataset,0x1e,0.05);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,argv[2],(allocator<char> *)&local_120);
        mnist_model_save(&local_100,&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        mnist_model::~mnist_model(&local_100);
        iVar3 = 0;
      }
    }
    return iVar3;
  }
  main_cold_1();
  if (local_140._M_dataplus._M_p != (pointer)(ulong)(uint)argc) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  mnist_model::~mnist_model(&local_100);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char ** argv) {
    if (argc != 5 && argc != 6) {
        fprintf(stderr, "Usage: %s mnist-fc mnist-fc-f32.gguf data/MNIST/raw/train-images-idx3-ubyte data/MNIST/raw/train-labels-idx1-ubyte [CPU/CUDA0]\n", argv[0]);
        exit(0);
    }

    // The MNIST model is so small that the overhead from data shuffling is non-negligible, especially with CUDA.
    // With a shard size of 10 this overhead is greatly reduced at the cost of less shuffling (does not seem to have a significant impact).
    // A batch of 500 images then consists of 50 random shards of size 10 instead of 500 random shards of size 1.
    ggml_opt_dataset_t dataset = ggml_opt_dataset_init(MNIST_NINPUT, MNIST_NCLASSES, MNIST_NTRAIN, /*ndata_shard =*/ 10);

    if (!mnist_image_load(argv[3], dataset)) {
        return 1;
    }
    if (!mnist_label_load(argv[4], dataset)) {
        return 1;
    }

    mnist_model model = mnist_model_init_random(argv[1], argc >= 6 ? argv[5] : "", MNIST_NBATCH_LOGICAL, MNIST_NBATCH_PHYSICAL);

    mnist_model_build(model);

    mnist_model_train(model, dataset, /*nepoch =*/ 30, /*val_split =*/ 0.05f);

    mnist_model_save(model, argv[2]);
}